

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readHeader
          (HttpInputStreamImpl *this,HeaderType type,size_t bufferStart,size_t bufferEnd)

{
  Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *this_00;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *value;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *value_00;
  DebugComparison<unsigned_long_&,_unsigned_long_&> *params;
  long *plVar1;
  long *plVar2;
  Promise<unsigned_long> *promise;
  undefined8 *puVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  PromiseArenaMember *pPVar7;
  long lVar8;
  char (*params_00) [24];
  undefined8 uVar9;
  undefined8 *puVar10;
  size_t sVar11;
  SourceLocation location;
  int iVar12;
  coroutine_handle<void> coroutine;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  undefined **ppuVar18;
  undefined **__n;
  undefined4 in_register_00000034;
  undefined8 in_R8;
  long lVar19;
  char (*pacVar20) [24];
  ulong uVar21;
  undefined **ppuVar22;
  bool bVar23;
  Fault f;
  Exception local_1c0;
  
  coroutine._M_fr_ptr = operator_new(0x558);
  *(code **)coroutine._M_fr_ptr = readHeader;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readHeader;
  this_00 = (Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(int *)((long)coroutine._M_fr_ptr + 0x550) = (int)bufferStart;
  *(ulong *)((long)coroutine._M_fr_ptr + 0x540) = CONCAT44(in_register_00000034,type);
  *(size_t *)((long)coroutine._M_fr_ptr + 0x520) = bufferEnd;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x528) = in_R8;
  local_1c0.ownFile.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_1c0.ownFile.content.size_ = 0x4f0cd2;
  local_1c0.ownFile.content.disposer = (ArrayDisposer *)0x4a000006bb;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0061d640;
  ppuVar22 = &PTR_traceEvent_0061d688;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0061d688;
  location.function = "readHeader";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x6bb;
  location.columnNumber = 0x4a;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x278);
  value = (FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
          ((long)coroutine._M_fr_ptr + 0x438);
  value_00 = (FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
             ((long)coroutine._M_fr_ptr + 0x478);
  params = (DebugComparison<unsigned_long_&,_unsigned_long_&> *)((long)coroutine._M_fr_ptr + 0x4b8);
  plVar1 = (long *)((long)coroutine._M_fr_ptr + 0x520);
  plVar2 = (long *)((long)coroutine._M_fr_ptr + 0x528);
  promise = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x530);
  puVar3 = (undefined8 *)((long)coroutine._M_fr_ptr + 0x538);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0061d640;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0061d688;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  do {
    *(undefined ***)((long)coroutine._M_fr_ptr + 0x548) = ppuVar22;
    lVar16 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x530) = 0;
    lVar6 = *(long *)(lVar16 + 0x40);
    if (lVar6 == 0) {
      uVar21 = *(ulong *)((long)coroutine._M_fr_ptr + 0x528);
      iVar12 = *(int *)((long)coroutine._M_fr_ptr + 0x550);
      if (uVar21 != *(ulong *)(lVar16 + 0x20)) {
LAB_00395fdd:
        if (iVar12 == 1) {
          uVar14 = uVar21 - *(long *)((long)coroutine._M_fr_ptr + 0x520);
          *(ulong *)((long)coroutine._M_fr_ptr + 0x4e0) = uVar14;
          *(undefined8 **)((long)coroutine._M_fr_ptr + 0x4e8) =
               &(anonymous_namespace)::MAX_CHUNK_HEADER_SIZE;
          *(char **)((long)coroutine._M_fr_ptr + 0x4f0) = " <= ";
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4f8) = 5;
          *(bool *)((long)coroutine._M_fr_ptr + 0x500) = uVar14 < 0x21;
          if (uVar14 >= 0x21) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long_const&>&,char_const(&)[24]>
                      ((Fault *)&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x6fe,FAILED,"bufferEnd - bufferStart <= MAX_CHUNK_HEADER_SIZE",
                       "_kjCondition,\"invalid HTTP chunk size\"",
                       (DebugComparison<unsigned_long,_const_unsigned_long_&> *)
                       ((long)coroutine._M_fr_ptr + 0x4e0),(char (*) [24])"invalid HTTP chunk size")
            ;
            kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
          }
        }
LAB_003962a6:
        puVar10 = *(undefined8 **)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x10);
        (**(code **)*puVar10)
                  (puVar3,puVar10,
                   uVar21 + *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x18),1);
        pPVar7 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        (promise->super_PromiseBase).node.ptr = (PromiseNode *)*puVar3;
        *puVar3 = 0;
        if (pPVar7 != (PromiseArenaMember *)0x0) {
          kj::_::PromiseDisposer::dispose(pPVar7);
          pPVar7 = (PromiseArenaMember *)*puVar3;
          if (pPVar7 != (PromiseArenaMember *)0x0) {
            *puVar3 = 0;
            kj::_::PromiseDisposer::dispose(pPVar7);
          }
        }
        goto LAB_00395d21;
      }
      if (iVar12 == 0) {
        pacVar20 = (char (*) [24])0x0;
      }
      else {
        pacVar20 = *(char (**) [24])(lVar16 + 0x30);
      }
      params_00 = (char (*) [24])*plVar1;
      if (pacVar20 < params_00) {
        memmove(*pacVar20 + *(long *)(lVar16 + 0x18),*params_00 + *(long *)(lVar16 + 0x18),
                uVar21 - (long)params_00);
        uVar21 = (long)pacVar20 +
                 (*(long *)((long)coroutine._M_fr_ptr + 0x528) -
                 *(long *)((long)coroutine._M_fr_ptr + 0x520));
        *(ulong *)((long)coroutine._M_fr_ptr + 0x528) = uVar21;
        *(char (**) [24])((long)coroutine._M_fr_ptr + 0x520) = pacVar20;
        iVar12 = *(int *)((long)coroutine._M_fr_ptr + 0x550);
        goto LAB_00395fdd;
      }
      if (iVar12 != 0) {
        kj::_::Debug::makeDescription<char_const(&)[24]>
                  ((String *)((long)coroutine._M_fr_ptr + 0x508),(Debug *)0x4f0d6c,
                   "invalid HTTP chunk size",params_00);
        Exception::Exception
                  (&local_1c0,FAILED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x6e7,(String *)((long)coroutine._M_fr_ptr + 0x508));
        throwFatalException(&local_1c0,0);
      }
      if (uVar21 < 0x20000) {
        sVar11 = uVar21 * 2;
        pvVar15 = kj::_::HeapArrayDisposer::allocateImpl
                            (1,sVar11,sVar11,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        lVar16 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
        *(void **)((long)coroutine._M_fr_ptr + 0x278) = pvVar15;
        *(size_t *)((long)coroutine._M_fr_ptr + 0x280) = sVar11;
        *(undefined8 **)((long)coroutine._M_fr_ptr + 0x288) = &kj::_::HeapArrayDisposer::instance;
        memcpy(pvVar15,*(void **)(lVar16 + 0x18),*(size_t *)(lVar16 + 0x20));
        lVar16 = *(long *)(lVar16 + 0x18);
        if (lVar16 != 0) {
          lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
          uVar9 = *(undefined8 *)(lVar6 + 0x20);
          *(undefined8 *)(lVar6 + 0x18) = 0;
          *(undefined8 *)(lVar6 + 0x20) = 0;
          (**(code **)**(undefined8 **)(lVar6 + 0x28))
                    (*(undefined8 **)(lVar6 + 0x28),lVar16,1,uVar9,uVar9,0);
        }
        lVar16 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
        *(void **)(lVar16 + 0x18) = pvVar15;
        *(size_t *)(lVar16 + 0x20) = sVar11;
        *(undefined8 **)(lVar16 + 0x28) = &kj::_::HeapArrayDisposer::instance;
        uVar21 = *(ulong *)((long)coroutine._M_fr_ptr + 0x528);
        goto LAB_003962a6;
      }
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x468) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x470) = 0;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x438) = 2;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x440) = 0x1af;
      *(char **)((long)coroutine._M_fr_ptr + 0x448) = "Request Header Fields Too Large";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x450) = 0x20;
      *(char **)((long)coroutine._M_fr_ptr + 0x458) = "header too large.";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x460) = 0x12;
      kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::fulfill
                (this_00,value);
      iVar12 = 3;
      if (value->tag - 1 < 2) {
        value->tag = 0;
      }
    }
    else {
      bVar23 = *(long *)((long)coroutine._M_fr_ptr + 0x520) ==
               *(long *)((long)coroutine._M_fr_ptr + 0x528);
      *(long **)((long)coroutine._M_fr_ptr + 0x4b8) = plVar1;
      *(long **)((long)coroutine._M_fr_ptr + 0x4c0) = plVar2;
      *(char **)((long)coroutine._M_fr_ptr + 0x4c8) = " == ";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0) = 5;
      *(bool *)((long)coroutine._M_fr_ptr + 0x4d8) = bVar23;
      if (!bVar23) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  ((Fault *)&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x6cc,FAILED,"bufferStart == bufferEnd","_kjCondition,",params);
        kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
      }
      lVar16 = *(long *)(lVar16 + 0x38) - *(long *)(lVar16 + 0x18);
      *plVar1 = lVar16;
      *plVar2 = lVar16;
      *(long *)&__return_storage_ptr__->super_PromiseAwaiterBase = lVar6;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)params,(unsigned_long *)__return_storage_ptr__);
      pPVar7 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)params->left;
      if (pPVar7 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar7);
      }
      lVar16 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
      *(undefined8 *)(lVar16 + 0x38) = 0;
      *(undefined8 *)(lVar16 + 0x40) = 0;
LAB_00395d21:
      co_await<unsigned_long>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x554) = 0;
      bVar23 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar23) {
        return (PromiseBase)(PromiseBase)this;
      }
      ppuVar22 = (undefined **)
                 kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      lVar16 = *(long *)((long)coroutine._M_fr_ptr + 0x528);
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
      if (*(char *)(lVar6 + 0xd0) == '\0') {
        pvVar15 = *(void **)(lVar6 + 0x18);
        __n = ppuVar22;
      }
      else {
        ppuVar18 = ppuVar22;
        if ((lVar16 == *plVar1) && (*(char *)(*(long *)(lVar6 + 0x18) + lVar16) == '\r')) {
          lVar16 = lVar16 + 1;
          *plVar2 = lVar16;
          ppuVar18 = (undefined **)((long)ppuVar22 - 1);
        }
        iVar12 = 5;
        if (ppuVar18 == (undefined **)0x0) goto LAB_00395f4b;
        pvVar15 = *(void **)(lVar6 + 0x18);
        __n = ppuVar18;
        if (*(char *)((long)pvVar15 + lVar16) == '\n') {
          *(undefined1 *)(lVar6 + 0xd0) = 0;
          lVar16 = lVar16 + 1;
          *plVar2 = lVar16;
          *plVar1 = lVar16;
          __n = (undefined **)((long)ppuVar18 - 1U);
          iVar12 = 5;
          if ((undefined **)((long)ppuVar18 - 1U) == (undefined **)0x0) goto LAB_00395f4b;
        }
      }
      lVar6 = (long)__n + lVar16;
      pvVar13 = memchr((void *)(lVar16 + (long)pvVar15),10,(size_t)__n);
      if (pvVar13 != (void *)0x0) {
        iVar12 = *(int *)((long)coroutine._M_fr_ptr + 0x550);
        if (iVar12 == 1) {
          lVar16 = (long)pvVar13 + (1 - (long)pvVar15);
          lVar19 = (long)pvVar13 +
                   (~(ulong)(*(char *)((long)pvVar13 + -1) == '\r') - (long)pvVar15) + 1;
          lVar17 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
LAB_00395e71:
          *(undefined1 *)(lVar17 + 0xd0) = 1;
LAB_00395e7d:
          lVar17 = *(long *)((long)coroutine._M_fr_ptr + 0x520);
          lVar8 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
          *(long *)(lVar8 + 0x38) = (long)pvVar15 + lVar16;
          *(long *)(lVar8 + 0x40) = lVar6 - lVar16;
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x478) = 1;
          *(long *)((long)coroutine._M_fr_ptr + 0x480) = (long)pvVar15 + lVar17;
          *(long *)((long)coroutine._M_fr_ptr + 0x488) = lVar19 - lVar17;
          kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::fulfill
                    (this_00,value_00);
          iVar12 = 3;
          if (value_00->tag - 1 < 2) {
            value_00->tag = 0;
          }
          goto LAB_00395f4b;
        }
        do {
          lVar17 = (long)pvVar13 - (long)pvVar15;
          if (3 < lVar17) {
            cVar4 = *(char *)((long)pvVar13 + -1);
            cVar5 = cVar4;
            if (cVar4 == '\r') {
              cVar5 = *(char *)((long)pvVar13 + -2);
            }
            if (cVar5 == '\n') {
              lVar16 = lVar17 + 1;
              lVar19 = ~(ulong)(cVar4 == '\r') + lVar17 + 1;
              lVar17 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
              if (iVar12 != 0) goto LAB_00395e71;
              if ((ulong)(*(long *)(lVar17 + 0x20) - lVar6) < 0x20) {
                sVar11 = *(long *)(lVar17 + 0x20) * 2;
                pvVar15 = kj::_::HeapArrayDisposer::allocateImpl
                                    (1,sVar11,sVar11,(_func_void_void_ptr *)0x0,
                                     (_func_void_void_ptr *)0x0);
                lVar17 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
                *(void **)((long)coroutine._M_fr_ptr + 0x278) = pvVar15;
                *(size_t *)((long)coroutine._M_fr_ptr + 0x280) = sVar11;
                *(undefined8 **)((long)coroutine._M_fr_ptr + 0x288) =
                     &kj::_::HeapArrayDisposer::instance;
                memcpy(pvVar15,*(void **)(lVar17 + 0x18),*(size_t *)(lVar17 + 0x20));
                lVar17 = *(long *)(lVar17 + 0x18);
                if (lVar17 != 0) {
                  lVar8 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
                  *(undefined8 *)(lVar8 + 0x18) = 0;
                  *(undefined8 *)(lVar8 + 0x20) = 0;
                  (**(code **)**(undefined8 **)(lVar8 + 0x28))
                            (*(undefined8 **)(lVar8 + 0x28),lVar17,1);
                }
                lVar17 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
                *(void **)(lVar17 + 0x18) = pvVar15;
                *(size_t *)(lVar17 + 0x20) = sVar11;
                *(undefined8 **)(lVar17 + 0x28) = &kj::_::HeapArrayDisposer::instance;
                lVar17 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
              }
              *(long *)(lVar17 + 0x30) = lVar19;
              goto LAB_00395e7d;
            }
          }
          pvVar13 = memchr((void *)((long)pvVar15 + lVar17 + 1),10,lVar6 - (lVar17 + 1));
        } while (pvVar13 != (void *)0x0);
      }
      *plVar2 = lVar6;
      iVar12 = 0;
    }
LAB_00395f4b:
    pPVar7 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar7 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar7);
    }
    if ((iVar12 != 0) && (iVar12 != 5)) {
      if (iVar12 == 3) {
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x554) = 1;
      }
      else {
        if ((*(char *)((long)coroutine._M_fr_ptr + 0x230) == '\x01') &&
           (*(int *)((long)coroutine._M_fr_ptr + 0x238) - 1U < 2)) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
        }
        if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true)
        {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
        }
        kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
        operator_delete(coroutine._M_fr_ptr,0x558);
      }
      return (PromiseBase)(PromiseBase)this;
    }
  } while( true );
}

Assistant:

kj::Promise<kj::OneOf<kj::ArrayPtr<char>, HttpHeaders::ProtocolError>> readHeader(
      HeaderType type, size_t bufferStart, size_t bufferEnd) {
    // Reads the HTTP message header or a chunk header (as in transfer-encoding chunked) and
    // returns the buffer slice containing it.
    //
    // The main source of complication here is that we want to end up with one continuous buffer
    // containing the result, and that the input is delimited by newlines rather than by an upfront
    // length.

    for (;;) {
      kj::Promise<size_t> readPromise = nullptr;

      // Figure out where we're reading from.
      if (leftover != nullptr) {
        // Some data is still left over from the previous message, so start with that.

        // This can only happen if this is the initial run through the loop.
        KJ_ASSERT(bufferStart == bufferEnd);

        // OK, set bufferStart and bufferEnd to both point to the start of the leftover, and then
        // fake a read promise as if we read the bytes from the leftover.
        bufferStart = leftover.begin() - headerBuffer.begin();
        bufferEnd = bufferStart;
        readPromise = leftover.size();
        leftover = nullptr;
      } else {
        // Need to read more data from the underlying stream.

        if (bufferEnd == headerBuffer.size()) {
          // Out of buffer space.

          // Maybe we can move bufferStart backwards to make more space at the end?
          size_t minStart = type == HeaderType::MESSAGE ? 0 : messageHeaderEnd;

          if (bufferStart > minStart) {
            // Move to make space.
            memmove(headerBuffer.begin() + minStart, headerBuffer.begin() + bufferStart,
                    bufferEnd - bufferStart);
            bufferEnd = bufferEnd - bufferStart + minStart;
            bufferStart = minStart;
          } else {
            // Really out of buffer space. Grow the buffer.
            if (type != HeaderType::MESSAGE) {
              // Can't grow because we'd invalidate the HTTP headers.
              kj::throwFatalException(KJ_EXCEPTION(FAILED, "invalid HTTP chunk size"));
            }
            if (headerBuffer.size() >= MAX_BUFFER) {
              co_return HttpHeaders::ProtocolError {
                  .statusCode = 431,
                  .statusMessage = "Request Header Fields Too Large",
                  .description = "header too large.",
                  .rawContent = nullptr };
            }
            auto newBuffer = kj::heapArray<char>(headerBuffer.size() * 2);
            memcpy(newBuffer.begin(), headerBuffer.begin(), headerBuffer.size());
            headerBuffer = kj::mv(newBuffer);
          }
        }

        // How many bytes will we read?
        size_t maxBytes = headerBuffer.size() - bufferEnd;

        if (type == HeaderType::CHUNK) {
          // Roughly limit the amount of data we read to MAX_CHUNK_HEADER_SIZE.
          // TODO(perf): This is mainly to avoid copying a lot of body data into our buffer just to
          //   copy it again when it is read. But maybe the copy would be cheaper than overhead of
          //   extra event loop turns?
          KJ_REQUIRE(bufferEnd - bufferStart <= MAX_CHUNK_HEADER_SIZE, "invalid HTTP chunk size");
          maxBytes = kj::min(maxBytes, MAX_CHUNK_HEADER_SIZE);
        }

        readPromise = inner.read(headerBuffer.begin() + bufferEnd, 1, maxBytes);
      }

      auto amount = co_await readPromise;

      if (lineBreakBeforeNextHeader) {
        // Hackily deal with expected leading line break.
        if (bufferEnd == bufferStart && headerBuffer[bufferEnd] == '\r') {
          ++bufferEnd;
          --amount;
        }

        if (amount > 0 && headerBuffer[bufferEnd] == '\n') {
          lineBreakBeforeNextHeader = false;
          ++bufferEnd;
          --amount;

          // Cut the leading line break out of the buffer entirely.
          bufferStart = bufferEnd;
        }

        if (amount == 0) {
          continue;
        }
      }

      size_t pos = bufferEnd;
      size_t newEnd = pos + amount;

      for (;;) {
        // Search for next newline.
        char* nl = reinterpret_cast<char*>(
            memchr(headerBuffer.begin() + pos, '\n', newEnd - pos));
        if (nl == nullptr) {
          // No newline found. Wait for more data.
          bufferEnd = newEnd;
          break;
        }

        // Is this newline which we found the last of the header? For a chunk header, always. For
        // a message header, we search for two newlines in a row. We accept either "\r\n" or just
        // "\n" as a newline sequence (though the standard requires "\r\n").
        if (type == HeaderType::CHUNK ||
            (nl - headerBuffer.begin() >= 4 &&
             ((nl[-1] == '\r' && nl[-2] == '\n') || (nl[-1] == '\n')))) {
          // OK, we've got all the data!

          size_t endIndex = nl + 1 - headerBuffer.begin();
          size_t leftoverStart = endIndex;

          // Strip off the last newline from end.
          endIndex -= 1 + (nl[-1] == '\r');

          if (type == HeaderType::MESSAGE) {
            if (headerBuffer.size() - newEnd < MAX_CHUNK_HEADER_SIZE) {
              // Ugh, there's not enough space for the secondary await buffer. Grow once more.
              auto newBuffer = kj::heapArray<char>(headerBuffer.size() * 2);
              memcpy(newBuffer.begin(), headerBuffer.begin(), headerBuffer.size());
              headerBuffer = kj::mv(newBuffer);
            }
            messageHeaderEnd = endIndex;
          } else {
            // For some reason, HTTP specifies that there will be a line break after each chunk.
            lineBreakBeforeNextHeader = true;
          }

          auto result = headerBuffer.slice(bufferStart, endIndex);
          leftover = headerBuffer.slice(leftoverStart, newEnd);
          co_return result;
        } else {
          pos = nl - headerBuffer.begin() + 1;
        }
      }

      // If we're here, we broke out of the inner loop because we need to read more data.
    }
  }